

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O2

MatrixXd * __thiscall OpenNN::Layer::to_matrix(Layer *this)

{
  Matrix<double,_1,_1,0,_1,_1> *this_00;
  reference ppNVar1;
  Scalar *pSVar2;
  int i;
  ulong __n;
  double dVar3;
  int local_24;
  unsigned_long local_20;
  
  this_00 = (Matrix<double,_1,_1,0,_1,_1> *)operator_new(0x18);
  local_24 = 1;
  local_20 = (long)(this->neurons).
                   super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->neurons).
                   super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>(this_00,&local_24,&local_20);
  for (__n = 0; __n < (ulong)((long)(this->neurons).
                                    super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->neurons).
                                    super__Vector_base<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    ppNVar1 = std::vector<OpenNN::Neuron_*,_std::allocator<OpenNN::Neuron_*>_>::at
                        (&this->neurons,__n);
    dVar3 = Neuron::get_value(*ppNVar1);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_00,0,
                        __n);
    *pSVar2 = dVar3;
  }
  return (MatrixXd *)this_00;
}

Assistant:

Eigen::MatrixXd* OpenNN::Layer::to_matrix() {
    Eigen::MatrixXd* matrix = new Eigen::MatrixXd(1, this->neurons.size());
    for (int i = 0; i < this->neurons.size(); i++) {
        (*matrix)(0, i) = this->neurons.at(i)->get_value();
    }
    return matrix;
}